

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ErrorList.cpp
# Opt level: O0

ostream * amrex::operator<<(ostream *os,ErrorList *elst)

{
  int iVar1;
  ErrorType EVar2;
  ErrorRec *pEVar3;
  string *psVar4;
  ostream *poVar5;
  ErrorList *in_RDI;
  int i;
  int in_stack_ffffffffffffffcc;
  ErrorList *this;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    iVar1 = ErrorList::size((ErrorList *)0x12f4c18);
    if (iVar1 <= local_14) break;
    this = in_RDI;
    pEVar3 = ErrorList::operator[](in_RDI,in_stack_ffffffffffffffcc);
    psVar4 = ErrorRec::name_abi_cxx11_(pEVar3);
    poVar5 = std::operator<<((ostream *)this,(string *)psVar4);
    poVar5 = std::operator<<(poVar5,' ');
    pEVar3 = ErrorList::operator[](this,in_stack_ffffffffffffffcc);
    iVar1 = ErrorRec::nGrow(pEVar3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
    poVar5 = std::operator<<(poVar5,' ');
    pEVar3 = ErrorList::operator[](this,in_stack_ffffffffffffffcc);
    EVar2 = ErrorRec::errType(pEVar3);
    poVar5 = std::operator<<(poVar5,*(char **)(err_name + (ulong)EVar2 * 8));
    std::operator<<(poVar5,'\n');
    local_14 = local_14 + 1;
  }
  return (ostream *)in_RDI;
}

Assistant:

std::ostream&
operator << (std::ostream&    os,
             const ErrorList& elst)
{
    for (int i = 0; i < elst.size(); i++)
    {
        os << elst[i].name()
           << ' '
           << elst[i].nGrow()
           << ' '
           << err_name[elst[i].errType()]
           << '\n';
    }
    return os;
}